

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O1

VerySimpleReadOnlyString __thiscall
Strings::VerySimpleReadOnlyString::fromLast
          (VerySimpleReadOnlyString *this,VerySimpleReadOnlyString *find,bool includeFind)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  int in_ECX;
  undefined7 in_register_00000011;
  VerySimpleReadOnlyString *needle;
  ulong uVar5;
  ulong extraout_RDX;
  int iVar6;
  char *__s;
  char *pcVar7;
  VerySimpleReadOnlyString VVar8;
  
  needle = (VerySimpleReadOnlyString *)CONCAT71(in_register_00000011,includeFind);
  uVar2 = reverseFind(find,needle,0xffffffff);
  uVar1 = find->length;
  uVar5 = (ulong)uVar1;
  iVar6 = needle->length;
  if (in_ECX != 0) {
    iVar6 = 0;
  }
  pcVar7 = "";
  if (in_ECX != 0) {
    pcVar7 = find->data;
  }
  uVar3 = uVar1 - uVar2;
  __s = find->data + (iVar6 + uVar2);
  if (uVar3 == 0) {
    __s = pcVar7;
  }
  if (uVar3 != 0) {
    if ((char)in_ECX == '\0') {
      uVar3 = uVar1 - (uVar2 + needle->length);
      uVar5 = (ulong)uVar3;
    }
  }
  else {
    uVar3 = 0;
    if ((char)in_ECX != '\0') {
      uVar3 = uVar1;
    }
  }
  this->data = __s;
  if (uVar3 == 0xffffffff) {
    if (__s == (char *)0x0) {
      uVar3 = 0;
    }
    else {
      sVar4 = strlen(__s);
      uVar3 = (uint)sVar4;
      uVar5 = extraout_RDX;
    }
  }
  this->length = uVar3;
  VVar8._8_8_ = uVar5;
  VVar8.data = (tCharPtr)this;
  return VVar8;
}

Assistant:

const VerySimpleReadOnlyString VerySimpleReadOnlyString::fromLast(const VerySimpleReadOnlyString & find, const bool includeFind) const
	{
	    const unsigned int pos = reverseFind(find);
	    return VerySimpleReadOnlyString(pos == (unsigned int)length ? (includeFind ? data : "") : &data[includeFind ? pos : pos + (unsigned int)find.length],
	                                    pos == (unsigned int)length ? (includeFind ? (unsigned int)length : 0) : (includeFind ? (unsigned int)length - pos : (unsigned int)length - pos - (unsigned int)find.length));
	}